

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtouchhandler.cpp
# Opt level: O0

int __thiscall
QEvdevTouchScreenData::findClosestContact
          (QEvdevTouchScreenData *this,QHash<int,_QEvdevTouchScreenData::Contact> *contacts,int x,
          int y,int *dist)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  QHash<int,_QEvdevTouchScreenData::Contact> *in_R8;
  long in_FS_OFFSET;
  int dist_1;
  int dy;
  int dx;
  Contact *contact;
  int id;
  int minDist;
  const_iterator ite;
  const_iterator it;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Contact *in_stack_ffffffffffffffa8;
  int iVar4;
  int iVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = -1;
  iVar4 = -1;
  QHash<int,_QEvdevTouchScreenData::Contact>::constBegin(in_R8);
  QHash<int,_QEvdevTouchScreenData::Contact>::constEnd
            ((QHash<int,_QEvdevTouchScreenData::Contact> *)in_stack_ffffffffffffffa8);
  while( true ) {
    bVar2 = QHash<int,_QEvdevTouchScreenData::Contact>::const_iterator::operator!=
                      ((const_iterator *)in_stack_ffffffffffffffa8,
                       (const_iterator *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (!bVar2) break;
    in_stack_ffffffffffffffa8 =
         QHash<int,_QEvdevTouchScreenData::Contact>::const_iterator::value
                   ((const_iterator *)0x14d7a6);
    in_stack_ffffffffffffffa4 = in_EDX - in_stack_ffffffffffffffa8->x;
    in_stack_ffffffffffffffa0 = in_ECX - in_stack_ffffffffffffffa8->y;
    iVar3 = in_stack_ffffffffffffffa4 * in_stack_ffffffffffffffa4 +
            in_stack_ffffffffffffffa0 * in_stack_ffffffffffffffa0;
    if ((iVar5 == -1) || (iVar3 < iVar5)) {
      iVar4 = in_stack_ffffffffffffffa8->trackingId;
      iVar5 = iVar3;
    }
    QHash<int,_QEvdevTouchScreenData::Contact>::const_iterator::operator++
              ((const_iterator *)CONCAT44(iVar5,iVar4));
  }
  if (in_R8 != (QHash<int,_QEvdevTouchScreenData::Contact> *)0x0) {
    *(int *)&in_R8->d = iVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int QEvdevTouchScreenData::findClosestContact(const QHash<int, Contact> &contacts, int x, int y, int *dist)
{
    int minDist = -1, id = -1;
    for (QHash<int, Contact>::const_iterator it = contacts.constBegin(), ite = contacts.constEnd();
         it != ite; ++it) {
        const Contact &contact(it.value());
        int dx = x - contact.x;
        int dy = y - contact.y;
        int dist = dx * dx + dy * dy;
        if (minDist == -1 || dist < minDist) {
            minDist = dist;
            id = contact.trackingId;
        }
    }
    if (dist)
        *dist = minDist;
    return id;
}